

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf64.c
# Opt level: O0

void elf64_makeshstrtab(void)

{
  unsigned_long uVar1;
  uint32_t unaff_retaddr;
  uint32_t in_stack_00000008;
  uint64_t in_stack_00000010;
  uint64_t in_stack_00000018;
  bool in_stack_00000020;
  bool be;
  uint in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffec;
  uint32_t in_stack_fffffffffffffff0;
  uint32_t in_stack_fffffffffffffff4;
  
  elf64_addshdr(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,
                CONCAT44(in_stack_ffffffffffffffec,(uint)(elf_endianess == '\x01')),0,1,
                (ulong)in_stack_ffffffffffffffd4 << 0x20,unaff_retaddr,in_stack_00000008,
                in_stack_00000010,in_stack_00000018,in_stack_00000020);
  elfoffset = elfshstrlist.nextindex + elfoffset;
  uVar1 = align((ulong)elfoffset,2);
  elfoffset = elfoffset + (int)uVar1;
  return;
}

Assistant:

static void elf64_makeshstrtab(void)
/* creates .shstrtab */
{
  bool be = elf_endianess == _BIG_ENDIAN_;

  elf64_addshdr(elfshstrtabidx,SHT_STRTAB,0,0,elfoffset,
                elfshstrlist.nextindex,0,0,1,0,be);
  elfoffset += elfshstrlist.nextindex;
  elfoffset += align(elfoffset,2);
}